

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_encoder.cc
# Opt level: O2

void __thiscall draco::ObjEncoder::EncodeFloatList(ObjEncoder *this,float *vals,int num_vals)

{
  ulong uVar1;
  ulong uVar2;
  char local_29;
  
  uVar2 = 0;
  uVar1 = (ulong)(uint)num_vals;
  if (num_vals < 1) {
    uVar1 = uVar2;
  }
  for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    if (uVar2 != 0) {
      local_29 = ' ';
      EncoderBuffer::Encode<char>(this->out_buffer_,&local_29);
    }
    EncodeFloat(this,vals[uVar2]);
  }
  return;
}

Assistant:

void ObjEncoder::EncodeFloatList(float *vals, int num_vals) {
  for (int i = 0; i < num_vals; ++i) {
    if (i > 0) {
      buffer()->Encode(' ');
    }
    EncodeFloat(vals[i]);
  }
}